

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void Discover(void)

{
  long lVar1;
  sockaddr *psVar2;
  bool bVar3;
  int iVar4;
  ifaddrs *piVar5;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  char (*in_stack_ffffffffffffff78) [9];
  ifaddrs *myaddrs;
  _Alloc_hider in_stack_ffffffffffffff88;
  CNetAddr addr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (fDiscover) {
    piVar5 = (ifaddrs *)&myaddrs;
    iVar4 = getifaddrs(piVar5);
    if (iVar4 == 0) {
LAB_00181228:
      piVar5 = piVar5->ifa_next;
      if (piVar5 != (ifaddrs *)0x0) {
        psVar2 = piVar5->ifa_addr;
        if ((psVar2 != (sockaddr *)0x0) && ((piVar5->ifa_flags & 9) == 1)) {
          if (psVar2->sa_family == 10) {
            CNetAddr::CNetAddr(&addr,(in6_addr *)(psVar2->sa_data + 6),0);
            bVar3 = AddLocal(&addr,1);
            if (bVar3) {
              CNetAddr::ToStringAddr_abi_cxx11_((string *)&stack0xffffffffffffff88,&addr);
              logging_function_00._M_str = "Discover";
              logging_function_00._M_len = 8;
              source_file_00._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
              ;
              source_file_00._M_len = 0x50;
              LogPrintf_<char[9],char*,std::__cxx11::string>
                        (logging_function_00,source_file_00,0xc4e,
                         I2P|VALIDATION|QT|MEMPOOLREJ|PROXY|PRUNE|REINDEX|SELECTCOINS|ESTIMATEFEE|
                         ZMQ|MEMPOOL|TOR,(int)piVar5 + 8,(char *)&stack0xffffffffffffff88,
                         in_stack_ffffffffffffff78,(char **)myaddrs,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffff88._M_p);
              std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
            }
          }
          else {
            if (psVar2->sa_family != 2) goto LAB_00181228;
            CNetAddr::CNetAddr(&addr,(in_addr *)(psVar2->sa_data + 2));
            bVar3 = AddLocal(&addr,1);
            if (bVar3) {
              CNetAddr::ToStringAddr_abi_cxx11_((string *)&stack0xffffffffffffff88,&addr);
              logging_function._M_str = "Discover";
              logging_function._M_len = 8;
              source_file._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
              ;
              source_file._M_len = 0x50;
              LogPrintf_<char[9],char*,std::__cxx11::string>
                        (logging_function,source_file,0xc47,
                         I2P|VALIDATION|QT|MEMPOOLREJ|PROXY|PRUNE|REINDEX|SELECTCOINS|ESTIMATEFEE|
                         BENCH|MEMPOOL|NET,(int)piVar5 + 8,(char *)&stack0xffffffffffffff88,
                         in_stack_ffffffffffffff78,(char **)myaddrs,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffff88._M_p);
              std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
            }
          }
          prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&addr.m_addr);
        }
        goto LAB_00181228;
      }
      freeifaddrs(myaddrs);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Discover()
{
    if (!fDiscover)
        return;

#ifdef WIN32
    // Get local host IP
    char pszHostName[256] = "";
    if (gethostname(pszHostName, sizeof(pszHostName)) != SOCKET_ERROR)
    {
        const std::vector<CNetAddr> addresses{LookupHost(pszHostName, 0, true)};
        for (const CNetAddr& addr : addresses)
        {
            if (AddLocal(addr, LOCAL_IF))
                LogPrintf("%s: %s - %s\n", __func__, pszHostName, addr.ToStringAddr());
        }
    }
#elif (HAVE_DECL_GETIFADDRS && HAVE_DECL_FREEIFADDRS)
    // Get local host ip
    struct ifaddrs* myaddrs;
    if (getifaddrs(&myaddrs) == 0)
    {
        for (struct ifaddrs* ifa = myaddrs; ifa != nullptr; ifa = ifa->ifa_next)
        {
            if (ifa->ifa_addr == nullptr) continue;
            if ((ifa->ifa_flags & IFF_UP) == 0) continue;
            if ((ifa->ifa_flags & IFF_LOOPBACK) != 0) continue;
            if (ifa->ifa_addr->sa_family == AF_INET)
            {
                struct sockaddr_in* s4 = (struct sockaddr_in*)(ifa->ifa_addr);
                CNetAddr addr(s4->sin_addr);
                if (AddLocal(addr, LOCAL_IF))
                    LogPrintf("%s: IPv4 %s: %s\n", __func__, ifa->ifa_name, addr.ToStringAddr());
            }
            else if (ifa->ifa_addr->sa_family == AF_INET6)
            {
                struct sockaddr_in6* s6 = (struct sockaddr_in6*)(ifa->ifa_addr);
                CNetAddr addr(s6->sin6_addr);
                if (AddLocal(addr, LOCAL_IF))
                    LogPrintf("%s: IPv6 %s: %s\n", __func__, ifa->ifa_name, addr.ToStringAddr());
            }
        }
        freeifaddrs(myaddrs);
    }
#endif
}